

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eimgfs.cpp
# Opt level: O1

void __thiscall
ImgfsFile::SectionEntry::SectionEntry(SectionEntry *this,uint64_t ofs,uint8_t *pdata)

{
  uint32_t uVar1;
  uchar *puVar2;
  string *__return_storage_ptr__;
  string local_40;
  
  (this->super_DirEntry)._ofs = ofs;
  (this->super_DirEntry)._magic = 0;
  (this->super_DirEntry)._indexptr = 0;
  (this->super_DirEntry)._indexsize = 0;
  (this->super_DirEntry)._size = 0;
  (this->super_DirEntry)._vptr_DirEntry = (_func_int **)&PTR__SectionEntry_00147250;
  nameinfo::nameinfo(&this->_name,pdata + 0xc);
  uVar1 = *(uint32_t *)pdata;
  (this->super_DirEntry)._magic = uVar1;
  if (uVar1 == 0xfffff6fd) {
    this->_datatable = *(uint32_t *)(pdata + 4);
    this->_nextsection = *(uint32_t *)(pdata + 8);
    (this->super_DirEntry)._size = *(uint32_t *)(pdata + 0x18);
    (this->super_DirEntry)._indexptr = *(uint32_t *)(pdata + 0x1c);
    (this->super_DirEntry)._indexsize = *(uint32_t *)(pdata + 0x20);
    puVar2 = std::
             __find_if<unsigned_char_const*,__gnu_cxx::__ops::_Iter_pred<ImgfsFile::SectionEntry::SectionEntry(unsigned_long,unsigned_char_const*)::_lambda(unsigned_char)_1_>>
                       (pdata + 0x24,pdata + 0x34);
    if (puVar2 != pdata + 0x34) {
      uVar1 = DirEntry::offset(&this->super_DirEntry);
      hexdump<unsigned_char_const*>(&local_40,pdata + 0x24,0x10,1,ET_LITTLEENDIAN);
      printf("WARNING: %08x :sectionent+24 not nul: %s\n",(ulong)uVar1,local_40._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_40._M_dataplus._M_p != &local_40.field_2) {
        operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
      }
    }
    if (this->_datatable != 0) {
      uVar1 = DirEntry::offset(&this->super_DirEntry);
      printf("WARNING: %08x : sectionent datatable=%08x\n",(ulong)uVar1,(ulong)this->_datatable);
    }
    return;
  }
  __return_storage_ptr__ = (string *)__cxa_allocate_exception(0x20);
  uVar1 = DirEntry::offset(&this->super_DirEntry);
  stringformat_abi_cxx11_
            (__return_storage_ptr__,"SectionEntry@%08x: invalid magic: %08x",(ulong)uVar1,
             (ulong)(this->super_DirEntry)._magic);
  __cxa_throw(__return_storage_ptr__,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
}

Assistant:

SectionEntry(uint64_t ofs, const uint8_t *pdata)
            : DirEntry(ofs), _name(pdata+12)
        {
            _magic= get32le(pdata);
            if (_magic!=MAGIC)
                throw stringformat("SectionEntry@%08x: invalid magic: %08x", offset(), _magic);
            _datatable= get32le(pdata+4);
            _nextsection= get32le(pdata+8);
            //name : pdata+12
            _size= get32le(pdata+24);
            _indexptr= get32le(pdata+28);
            _indexsize= get32le(pdata+32);

            if (std::find_if(pdata+36, pdata+36+16, [](uint8_t t) { return t!=0; })!=pdata+36+16)
                printf("WARNING: %08x :sectionent+24 not nul: %s\n", offset(), hexdump(pdata+36, 16).c_str());
            if (_datatable)
                printf("WARNING: %08x : sectionent datatable=%08x\n", offset(), _datatable);

        }